

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

size_t __thiscall
OpenSSLWrapper::SslConnection::SslGetOutData(SslConnection *this,uint8_t *szBuffer,size_t nBufLen)

{
  int iVar1;
  runtime_error *this_00;
  SslConnection *pSStack_40;
  int iResult;
  size_t nRead;
  size_t local_28;
  size_t nBufLen_local;
  uint8_t *szBuffer_local;
  SslConnection *this_local;
  
  local_28 = nBufLen;
  nBufLen_local = (size_t)szBuffer;
  szBuffer_local = (uint8_t *)this;
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->m_iWantState = this->m_iWantState & 0xfffffffd;
  pSStack_40 = (SslConnection *)0x0;
  iVar1 = BIO_read_ex(this->m_rbio,szBuffer,nBufLen,&stack0xffffffffffffffc0);
  if (iVar1 < 1) {
    this_local = (SslConnection *)0x0;
  }
  else {
    this_local = pSStack_40;
  }
  return (size_t)this_local;
}

Assistant:

size_t SslConnection::SslGetOutData(uint8_t* szBuffer, size_t nBufLen)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        m_iWantState &= ~2;
        size_t nRead = 0;
        const int iResult = BIO_read_ex(m_rbio, szBuffer, nBufLen, &nRead);
        if (iResult <= 0)
            return 0;
        return nRead;
    }